

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

cmListFileBacktrace * __thiscall
cmListFileBacktrace::operator=(cmListFileBacktrace *this,cmListFileBacktrace *r)

{
  undefined1 local_38 [8];
  cmListFileBacktrace tmp;
  cmListFileBacktrace *r_local;
  cmListFileBacktrace *this_local;
  
  tmp.Cur = (Entry *)r;
  cmListFileBacktrace((cmListFileBacktrace *)local_38,r);
  std::swap<cmListFileBacktrace::Entry*>(&this->Cur,(Entry **)&tmp.Bottom.Position.Position);
  std::swap<cmStateSnapshot>(&this->Bottom,(cmStateSnapshot *)local_38);
  ~cmListFileBacktrace((cmListFileBacktrace *)local_38);
  return this;
}

Assistant:

cmListFileBacktrace& cmListFileBacktrace::operator=(
  cmListFileBacktrace const& r)
{
  cmListFileBacktrace tmp(r);
  std::swap(this->Cur, tmp.Cur);
  std::swap(this->Bottom, tmp.Bottom);
  return *this;
}